

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jasmin.cpp
# Opt level: O2

void __thiscall Oric::Jasmin::set_motor_on(Jasmin *this,bool on)

{
  Observer *pOVar1;
  Drive *this_00;
  allocator<char> local_39;
  string local_38 [32];
  
  (this->super_DiskController).field_0x4e4 = on;
  this_00 = Storage::Disk::Controller::get_drive((Controller *)this);
  Storage::Disk::Drive::set_motor_on(this_00,(bool)(this->super_DiskController).field_0x4e4);
  pOVar1 = this->observer_;
  if (pOVar1 != (Observer *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_38,"Jasmin",&local_39);
    (*pOVar1->_vptr_Observer[4])(pOVar1,local_38,(ulong)on);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void Jasmin::set_motor_on(bool on) {
	motor_on_ = on;
	get_drive().set_motor_on(motor_on_);
	if(observer_) {
		observer_->set_led_status("Jasmin", on);
	}
}